

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolIndexSearch.h
# Opt level: O1

string * __thiscall
SymbolIndexSearch::operator()[abi_cxx11_
          (string *__return_storage_ptr__,SymbolIndexSearch *this,Token *token)

{
  string *htmlPage;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  pointer pbVar4;
  void *pvVar5;
  ulong uVar6;
  byte bVar7;
  string_view *v;
  pointer pbVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string_view str;
  string_view delimiter;
  string_view subtoken;
  string_view subtoken_00;
  string_view subtoken_01;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  subtokens;
  string local_108;
  string local_e8;
  string *local_c8;
  SearchBase *local_c0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b8;
  ulong local_a0;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_98;
  byte local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  Page *local_78;
  string local_70;
  string local_50;
  
  if (token->type == std) {
    str._M_str = (token->content)._M_dataplus._M_p;
    str._M_len = (token->content)._M_string_length;
    delimiter._M_str = "::";
    delimiter._M_len = 2;
    ::str::split(&local_b8,str,delimiter);
    pbVar4 = local_b8.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = local_b8.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4; pbVar8 = pbVar8 + 1)
    {
      if (pbVar8->_M_len == 0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        pcVar1 = pbVar8->_M_str;
        pvVar5 = memchr(pcVar1,0x3c,pbVar8->_M_len);
        uVar6 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar1;
      }
      if (uVar6 != 0xffffffffffffffff) {
        pbVar8->_M_len = uVar6;
      }
      if (pbVar8->_M_len == 0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        pcVar1 = pbVar8->_M_str;
        pvVar5 = memchr(pcVar1,0x28,pbVar8->_M_len);
        uVar6 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar1;
      }
      if (uVar6 != 0xffffffffffffffff) {
        pbVar8->_M_len = uVar6;
      }
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/w/cpp/symbol_index","");
    local_78 = SearchBase::getPage(&this->super_SearchBase,&local_50);
    local_c8 = __return_storage_ptr__;
    local_c0 = &this->super_SearchBase;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (ulong)((long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_80 = &local_c8->field_2;
      local_a0 = 1;
      lVar9 = 0x18;
      do {
        sVar2 = *(size_t *)
                 ((long)local_b8.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
        pcVar1 = *(char **)((long)&(local_b8.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar9);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"<span>","");
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"</span>","");
        htmlPage = &local_78->content;
        subtoken._M_str = pcVar1;
        subtoken._M_len = sVar2;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_98._M_value,local_c0,htmlPage,subtoken,&local_e8,&local_108);
        bVar7 = local_88;
        uVar10 = local_98._M_value._M_str;
        uVar11 = local_98._M_value._M_len;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((bVar7 & 1) == 0) {
          sVar2 = *(size_t *)
                   ((long)local_b8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
          pcVar1 = *(char **)((long)&(local_b8.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar9);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"<code>","");
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"</code>","");
          subtoken_00._M_str = pcVar1;
          subtoken_00._M_len = sVar2;
          SearchBase::findLinkToSubtoken
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_98._M_value,local_c0,htmlPage,subtoken_00,&local_e8,&local_108);
          bVar7 = local_88;
          uVar10 = local_98._M_value._M_str;
          uVar11 = local_98._M_value._M_len;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((bVar7 & 1) == 0) {
          sVar2 = *(size_t *)
                   ((long)local_b8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
          pcVar1 = *(char **)((long)&(local_b8.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar9);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"<tt>","");
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"</tt>","");
          subtoken_01._M_str = pcVar1;
          subtoken_01._M_len = sVar2;
          SearchBase::findLinkToSubtoken
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_98._M_value,local_c0,htmlPage,subtoken_01,&local_e8,&local_108);
          bVar7 = local_88;
          uVar10 = local_98._M_value._M_str;
          uVar11 = local_98._M_value._M_len;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((bVar7 & 1) == 0) {
          (local_c8->_M_dataplus)._M_p = (pointer)local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
LAB_00151f6a:
          bVar3 = false;
        }
        else {
          if (local_a0 ==
              ((long)local_b8.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
            (local_c8->_M_dataplus)._M_p = (pointer)local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,uVar10,(char *)(uVar10 + uVar11));
            goto LAB_00151f6a;
          }
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,uVar10,(char *)(uVar10 + uVar11));
          local_78 = SearchBase::getPage(local_c0,&local_70);
          bVar3 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if (!bVar3) goto LAB_00152024;
        local_a0 = local_a0 + 1;
        lVar9 = lVar9 + 0x10;
      } while (local_a0 <
               (ulong)((long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    (local_c8->_M_dataplus)._M_p = (pointer)&local_c8->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
LAB_00152024:
    __return_storage_ptr__ = local_c8;
    if (local_b8.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_c8;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
		if (token.type != Token::Type::std) {
			return "";
		}

		std::vector<std::string_view> subtokens = str::split(token.content, "::");
		for (std::string_view& v : subtokens) {
			const size_t start_template = v.find('<');
			if (start_template != std::string_view::npos) {
				v.remove_suffix(v.size() - start_template);
			}

			const size_t start_parenthesis = v.find('(');
			if (start_parenthesis != std::string_view::npos) {
				v.remove_suffix(v.size() - start_parenthesis);
			}
		}

		Page* page = getPage("/w/cpp/symbol_index");
		for (size_t i = 1; i < subtokens.size(); i++) {
			std::optional<std::string_view> link;

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<span>", "</span>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<code>", "</code>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<tt>", "</tt>");
			}

			if (!link.has_value()) {
				return "";
			}


			if (i == subtokens.size() - 1) {
				return std::string(link.value());
			}

			page = getPage(std::string(link.value()));
		}

		return "";
	}